

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O3

void beltFMTStepD(u16 *buf,octet *iv,void *state)

{
  octet *bin;
  long lVar1;
  long lVar2;
  octet *poVar3;
  long lVar4;
  void *src;
  long lVar5;
  void *local_48;
  
  if (iv == (octet *)0x0) {
    memSet((void *)((long)state + 0x74),'\0',0x10);
  }
  else {
    memCopy((void *)((long)state + 0x74),iv,0x10);
  }
  bin = (octet *)((long)state + 0x88);
  local_48 = (void *)((long)state + 0x80);
  src = (void *)((long)state + 0x84);
  lVar5 = -3;
  lVar2 = 0x14;
  lVar4 = 0x10;
  do {
    beltStr2Bin(bin,*(size_t *)((long)state + 0x60),*(u32 *)((long)state + 0x48),buf,
                *(size_t *)((long)state + 0x50));
    lVar1 = *(long *)((long)state + 0x60);
    poVar3 = beltH();
    memCopy(bin + lVar1 * 8,poVar3 + lVar2,4);
    memCopy((void *)((long)state + *(long *)((long)state + 0x60) * 8 + 0x8c),src,4);
    lVar1 = *(long *)((long)state + 0x60);
    if (lVar1 == 2) {
      belt32BlockEncr(bin,(u32 *)state);
    }
    else if (lVar1 == 1) {
      beltBlockEncr(bin,(u32 *)state);
    }
    else {
      beltWBLStepE(bin,lVar1 * 8 + 8,state);
    }
    beltBin2StrSub((ulong)*(uint *)((long)state + 0x48),buf + *(long *)((long)state + 0x50),
                   *(size_t *)((long)state + 0x58),bin,*(long *)((long)state + 0x60) + 1);
    beltStr2Bin(bin,*(size_t *)((long)state + 0x68),*(u32 *)((long)state + 0x48),
                buf + *(long *)((long)state + 0x50),*(size_t *)((long)state + 0x58));
    lVar1 = *(long *)((long)state + 0x68);
    poVar3 = beltH();
    memCopy(bin + lVar1 * 8,poVar3 + lVar4,4);
    memCopy((void *)((long)state + *(long *)((long)state + 0x68) * 8 + 0x8c),local_48,4);
    lVar1 = *(long *)((long)state + 0x68);
    if (lVar1 == 2) {
      belt32BlockEncr(bin,(u32 *)state);
    }
    else if (lVar1 == 1) {
      beltBlockEncr(bin,(u32 *)state);
    }
    else {
      beltWBLStepE(bin,lVar1 * 8 + 8,state);
    }
    beltBin2StrSub((ulong)*(uint *)((long)state + 0x48),buf,*(size_t *)((long)state + 0x50),bin,
                   *(long *)((long)state + 0x68) + 1);
    lVar2 = lVar2 + -8;
    local_48 = (void *)((long)local_48 + -8);
    src = (void *)((long)src + -8);
    lVar4 = lVar4 + -8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  return;
}

Assistant:

void beltFMTStepD(u16 buf[], const octet iv[16], void* state)
{
	belt_fmt_st* st = (belt_fmt_st*)state;
	size_t i;
	ASSERT(memIsValid(state, sizeof(belt_fmt_st)));
	ASSERT(memIsValid(state, beltFMT_keep(st->mod, st->n1 + st->n2)));
	ASSERT(memIsNullOrValid(iv, 16));
	ASSERT(memIsValid(buf, 2 * st->n1 + 2 * st->n2));
	// подготовить синхропосылку
	if (iv)
		memCopy(st->iv + 4, iv, 16);
	else
		memSetZero(st->iv + 4, 16);
	// такты
	for (i = 3; i--;)
	{
		// вторая половинка
		beltStr2Bin(st->buf, st->b1, st->mod, buf, st->n1);
		memCopy(st->buf + st->b1 * 8, beltH() + 8 * i + 4, 4);
		memCopy(st->buf + st->b1 * 8 + 4, st->iv + 8 * i + 4, 4);
		if (st->b1 == 1)
			beltBlockEncr(st->buf, st->wbl->key);
		else if (st->b1 == 2)
			belt32BlockEncr(st->buf, st->wbl->key);
		else
			beltWBLStepE(st->buf, 8 * st->b1 + 8, st->wbl);
		beltBin2StrSub(st->mod, buf + st->n1, st->n2, st->buf, st->b1 + 1);
		// первая половинка
		beltStr2Bin(st->buf, st->b2, st->mod, buf + st->n1, st->n2);
		memCopy(st->buf + st->b2 * 8, beltH() + 8 * i, 4);
		memCopy(st->buf + st->b2 * 8 + 4, st->iv + 8 * i, 4);
		if (st->b2 == 1)
			beltBlockEncr(st->buf, st->wbl->key);
		else if (st->b2 == 2)
			belt32BlockEncr(st->buf, st->wbl->key);
		else
			beltWBLStepE(st->buf, 8 * st->b2 + 8, st->wbl);
		beltBin2StrSub(st->mod, buf, st->n1, st->buf, st->b2 + 1);
	}	
}